

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_preprocessor.c
# Opt level: O2

void free_define(Context_conflict1 *ctx,Define *def)

{
  int i;
  long lVar1;
  
  if (def != (Define *)0x0) {
    for (lVar1 = 0; lVar1 < def->paramcount; lVar1 = lVar1 + 1) {
      (*ctx->free)(def->parameters[lVar1],ctx->malloc_data);
    }
    (*ctx->free)(def->parameters,ctx->malloc_data);
    (*ctx->free)(def->identifier,ctx->malloc_data);
    (*ctx->free)(def->definition,ctx->malloc_data);
    (*ctx->free)(def->original,ctx->malloc_data);
    def->next = ctx->define_pool;
    ctx->define_pool = def;
  }
  return;
}

Assistant:

static void free_define(Context *ctx, Define *def)
{
    if (def != NULL)
    {
        int i;
        for (i = 0; i < def->paramcount; i++)
            Free(ctx, (void *) def->parameters[i]);
        Free(ctx, (void *) def->parameters);
        Free(ctx, (void *) def->identifier);
        Free(ctx, (void *) def->definition);
        Free(ctx, (void *) def->original);
        put_define(ctx, def);
    } // if
}